

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>::
KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<3UL>,_unsigned_long,_void>
           *this,string *notSortedStorageFilename,string *sortedStorageFilename,
          shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *innerRegisterSupplier)

{
  undefined8 *in_RDI;
  InnerRegisterSupplier *in_stack_fffffffffffffe88;
  path *in_stack_fffffffffffffe90;
  path *this_00;
  path *in_stack_fffffffffffffe98;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  *in_stack_fffffffffffffea0;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  *this_01;
  format in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  path *in_stack_fffffffffffffef0;
  InnerRegisterSupplier *in_stack_fffffffffffffef8;
  shared_ptr<supermap::io::FileManager> *in_stack_ffffffffffffff00;
  path *in_stack_ffffffffffffff08;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  *in_stack_ffffffffffffff10;
  
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<supermap::io::FileManager>,std::function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>>>()>)::_lambda()_1_,void>
            ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
              *)in_stack_fffffffffffffea0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe98);
  IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::OrderedStorage((IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                    *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1dd28e);
  *in_RDI = &PTR_append_0038d238;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee7);
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffe90,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffe88);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<supermap::io::FileManager>,std::function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>>>()>)::_lambda()_2_,void>
            ((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
              *)in_stack_fffffffffffffea0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffe98);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void,_supermap::Key<2UL>_>
  ::SingleFileIndexedStorage
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1dd31e);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1dd32b);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe90);
  this_01 = (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
             *)(in_RDI + 0xb);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee7);
  this_00 = (path *)&stack0xffffffffffffff08;
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)this_00,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffe88);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,void>>>()>
  ::
  function<supermap::KeyValueShrinkableStorage<supermap::Key<2ul>,supermap::ByteArray<3ul>,unsigned_long,void>::KeyValueShrinkableStorage(std::__cxx11::string_const&,std::__cxx11::string_const&,std::shared_ptr<supermap::io::FileManager>,std::function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2ul>,unsigned_long>,void>>>()>)::_lambda()_3_,void>
            (this_01,(anon_class_1_0_00000001 *)&stack0xfffffffffffffee8);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>_>_>_()>
               *)0x1dd3b5);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1dd3c2);
  std::filesystem::__cxx11::path::~path(this_00);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
              *)this_00,
             (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
              *)in_stack_fffffffffffffe88);
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::shared_ptr<io::FileManager> fileManager,
        InnerRegisterSupplier innerRegisterSupplier
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       fileManager,
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          fileManager,
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(std::move(innerRegisterSupplier)) {
    }